

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::from_integer<unsigned_long,std::__cxx11::wstring>
          (unsigned_long value,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  string *s;
  int *piVar1;
  undefined8 in_RSI;
  ulong in_RDI;
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  assertion_error *this;
  bool local_472;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  int *local_420;
  int local_418 [255];
  int aiStack_1c [3];
  undefined8 local_10;
  ulong local_8;
  
  local_420 = local_418;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    piVar1 = local_420 + 1;
    *local_420 = (int)(local_8 % 10) + 0x30;
    local_8 = local_8 / 10;
    local_472 = local_8 != 0 && piVar1 < aiStack_1c;
    local_420 = piVar1;
  } while (local_472);
  if (piVar1 == aiStack_1c) {
    s = (string *)__cxa_allocate_exception(0x10);
    this = (assertion_error *)&stack0xfffffffffffffbaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    assertion_error::assertion_error(this,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  while (local_420 = local_420 + -1, local_418 <= local_420) {
    std::__cxx11::wstring::push_back((wchar_t)local_10);
  }
  return (long)piVar1 - (long)local_418 >> 2;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }